

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::
map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
::erase_fixup(map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
              *this,Node *x)

{
  Node *in_RSI;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  *in_RDI;
  bool bVar1;
  Node *y;
  Node *local_18;
  Node *local_10;
  
  local_10 = in_RSI;
  while( true ) {
    bVar1 = false;
    if (local_10->parent != in_RDI->nil) {
      bVar1 = local_10->color == BLACK;
    }
    if (!bVar1) break;
    if (local_10->parent->left == local_10) {
      local_18 = local_10->parent->right;
      if (local_18->color == RED) {
        left_rotate(in_RDI,local_18);
        std::
        swap<sjtu::map<long,sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,unsigned_int,100,std::less<unsigned_long_long>>::node>::CacheNode*,std::less<long>>::color_type>
                  (&local_18->color,&local_18->left->color);
      }
      else if ((local_18->left->color == BLACK) && (local_18->right->color == BLACK)) {
        local_18->color = RED;
        local_10 = local_10->parent;
      }
      else {
        if (local_18->right->color == BLACK) {
          right_rotate(in_RDI,local_18->left);
          std::
          swap<sjtu::map<long,sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,unsigned_int,100,std::less<unsigned_long_long>>::node>::CacheNode*,std::less<long>>::color_type>
                    (&local_18->color,&local_18->parent->color);
          local_18 = local_18->parent;
        }
        left_rotate(in_RDI,local_18);
        std::
        swap<sjtu::map<long,sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,unsigned_int,100,std::less<unsigned_long_long>>::node>::CacheNode*,std::less<long>>::color_type>
                  (&local_18->color,&local_18->left->color);
        local_18->right->color = BLACK;
        local_10 = in_RDI->nil->left;
      }
    }
    else {
      local_18 = local_10->parent->left;
      if (local_18->color == RED) {
        right_rotate(in_RDI,local_18);
        std::
        swap<sjtu::map<long,sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,unsigned_int,100,std::less<unsigned_long_long>>::node>::CacheNode*,std::less<long>>::color_type>
                  (&local_18->color,&local_18->right->color);
      }
      else if ((local_18->left->color == BLACK) && (local_18->right->color == BLACK)) {
        local_18->color = RED;
        local_10 = local_10->parent;
      }
      else {
        if (local_18->left->color == BLACK) {
          left_rotate(in_RDI,local_18->right);
          std::
          swap<sjtu::map<long,sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,unsigned_int,100,std::less<unsigned_long_long>>::node>::CacheNode*,std::less<long>>::color_type>
                    (&local_18->color,&local_18->parent->color);
          local_18 = local_18->parent;
        }
        right_rotate(in_RDI,local_18);
        std::
        swap<sjtu::map<long,sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,unsigned_int,100,std::less<unsigned_long_long>>::node>::CacheNode*,std::less<long>>::color_type>
                  (&local_18->color,&local_18->right->color);
        local_18->left->color = BLACK;
        local_10 = in_RDI->nil->left;
      }
    }
  }
  local_10->color = BLACK;
  return;
}

Assistant:

void erase_fixup(Node *x)
	{
		for (Node *y;x -> parent != nil && x -> color == BLACK;)
			if (x -> parent -> left == x)
			{
				y = x -> parent -> right;
				if (y -> color == RED) left_rotate(y) , std::swap(y -> color , y -> left -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> right -> color == BLACK)
					{
						right_rotate(y -> left) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					left_rotate(y) , std::swap(y -> color , y -> left -> color) , y -> right -> color = BLACK;
					x = nil -> left;
				}
			}
			else
			{
				y = x -> parent -> left;
				if (y -> color == RED) right_rotate(y) , std::swap(y -> color , y -> right -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> left -> color == BLACK)
					{
						left_rotate(y -> right) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					right_rotate(y) , std::swap(y -> color , y -> right -> color) , y -> left -> color = BLACK;
					x = nil -> left;
				}
			}
		x -> color = BLACK;
	}